

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

void __thiscall
helics::CoreBroker::sendFedErrorAck(CoreBroker *this,ActionMessage *command,int32_t errorCode)

{
  byte *__src;
  route_id rVar1;
  ActionMessage badInit;
  ActionMessage AStack_e8;
  
  ActionMessage::ActionMessage(&AStack_e8,cmd_fed_ack);
  AStack_e8.flags._0_1_ = (byte)AStack_e8.flags | 0x10;
  AStack_e8.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
  AStack_e8.payload.bufferSize = (command->payload).bufferSize;
  __src = (command->payload).heap;
  AStack_e8.messageID = errorCode;
  if ((AStack_e8.payload.heap != __src) &&
     (SmallBuffer::reserve(&AStack_e8.payload,AStack_e8.payload.bufferSize),
     AStack_e8.payload.bufferSize != 0)) {
    memcpy(AStack_e8.payload.heap,__src,AStack_e8.payload.bufferSize);
  }
  rVar1 = getRoute(this,(GlobalFederateId)(command->source_id).gid);
  (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)(uint)rVar1.rid,&AStack_e8);
  ActionMessage::~ActionMessage(&AStack_e8);
  return;
}

Assistant:

void CoreBroker::sendFedErrorAck(ActionMessage& command, std::int32_t errorCode)
{
    ActionMessage badInit(CMD_FED_ACK);
    setActionFlag(badInit, error_flag);
    badInit.source_id = global_broker_id_local;
    badInit.messageID = errorCode;
    badInit.name(command.name());
    transmit(getRoute(command.source_id), badInit);
}